

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  size_t _elemsize;
  int *piVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  Option *opt_00;
  Mat *pMVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  float *pfVar26;
  float *pfVar27;
  uint uVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  undefined1 (*pauVar31) [16];
  long lVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [12];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar49;
  float fVar50;
  undefined1 auVar47 [16];
  float fVar51;
  undefined1 auVar48 [16];
  float fVar52;
  float fVar55;
  float fVar56;
  undefined1 auVar53 [16];
  float fVar57;
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar64 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ulong local_478;
  long local_470;
  undefined1 local_468 [16];
  Mat local_458;
  void *local_408;
  ulong local_400;
  long local_3f8;
  long local_3f0;
  ulong local_3e8;
  ulong local_3e0;
  long local_3d8;
  int local_3d0;
  int local_3cc;
  Mat local_3c8;
  Option *local_378;
  Mat *local_370;
  Mat local_368;
  Mat local_318;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  size_t local_2b8;
  Mat *local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  undefined1 local_288 [16];
  float afStack_278 [96];
  float afStack_f8 [50];
  
  iVar21 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar22 = bottom_blob->elempack;
  uVar1 = top_blob->w;
  uVar3 = top_blob->h;
  auVar37._4_4_ = uVar3;
  auVar37._0_4_ = uVar1;
  iVar5 = top_blob->c;
  piVar6 = bottom_blob->refcount;
  local_3c8.data = bottom_blob->data;
  local_3c8.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_3c8.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_3c8.elemsize._0_4_ = (undefined4)_elemsize;
  local_3c8.elemsize._4_4_ = (undefined4)(_elemsize >> 0x20);
  local_3c8.allocator = bottom_blob->allocator;
  uVar11 = bottom_blob->dims;
  uVar12 = bottom_blob->w;
  uVar13 = bottom_blob->h;
  uVar14 = bottom_blob->d;
  local_3c8.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  auVar40._8_4_ = 3;
  auVar40._0_8_ = 0x300000003;
  auVar40._12_4_ = 3;
  auVar37._8_8_ = 0;
  auVar37 = vpaddd_avx(auVar37,auVar40);
  auVar41 = vpsrad_avx(auVar37,0x1f);
  auVar41 = vpsrld_avx(auVar41,0x1e);
  local_468 = vpaddd_avx(auVar37,auVar41);
  auVar36._8_4_ = 0xfffffffc;
  auVar36._0_8_ = 0xfffffffcfffffffc;
  auVar36._12_4_ = 0xfffffffc;
  local_288 = vpand_avx(local_468,auVar36);
  local_2c8 = (ulong)local_288._4_4_;
  local_2d0 = CONCAT44((int)(local_3c8.cstep >> 0x20),local_288._0_4_);
  auVar41 = local_468;
  local_3c8.elempack = iVar22;
  local_3c8.dims = uVar11;
  local_3c8.w = uVar12;
  local_3c8.h = uVar13;
  local_3c8.d = uVar14;
  local_3c8.c = iVar21;
  local_2c0 = bias;
  local_2b0 = kernel_tm;
  copy_make_border(bottom_blob,&local_3c8,0,(local_288._4_4_ + 2) - bottom_blob->h,0,
                   (local_288._0_4_ + 2) - bottom_blob->w,0,0.0,opt);
  auVar37 = vpsrad_avx(local_468,2);
  local_368.cstep = 0;
  local_368.data = (void *)0x0;
  local_368.refcount._0_4_ = 0;
  local_368.refcount._4_4_ = 0;
  local_368.elemsize._0_4_ = 0;
  local_368.elemsize._4_4_ = 0;
  local_368.elempack = 0;
  local_368.allocator = (Allocator *)0x0;
  local_368.dims = 0;
  local_368.w = 0;
  local_368.h = 0;
  local_368.d = 0;
  local_368.c = 0;
  local_3d0 = iVar22;
  local_3cc = iVar5;
  local_378 = opt;
  local_370 = top_blob;
  local_2b8 = _elemsize;
  Mat::create(&local_368,auVar37._4_4_ * auVar37._0_4_,0x24,iVar21,_elemsize,iVar22,
              opt->workspace_allocator);
  pMVar19 = local_370;
  opt_00 = local_378;
  iVar21 = local_3cc;
  local_3f8 = (long)local_3c8.c;
  if (0 < local_3f8) {
    local_3e0 = (ulong)(uint)local_3c8.w;
    local_400 = (ulong)(uint)local_3c8.h;
    iVar22 = local_3c8.h + 1;
    if (-1 < (int)(local_3c8.h - 2U)) {
      iVar22 = local_3c8.h - 2U;
    }
    uVar28 = iVar22 >> 2;
    iVar22 = local_3c8.w + 1;
    if (-1 < (int)(local_3c8.w - 2U)) {
      iVar22 = local_3c8.w - 2U;
    }
    uVar20 = iVar22 >> 2;
    iVar22 = uVar20 * uVar28;
    uVar35 = 1;
    if (1 < (int)uVar20) {
      uVar35 = (ulong)uVar20;
    }
    if ((int)uVar28 < 2) {
      uVar28 = 1;
    }
    local_3e8 = (ulong)uVar28;
    local_3f0 = (long)(int)uVar20 * 0x10;
    local_408 = (void *)((long)(iVar22 * 4) * 4);
    local_290 = (long)(iVar22 * 8) * 4;
    local_298 = (long)(iVar22 * 0xc) * 4;
    local_2a8 = (long)(iVar22 * 0x14) * 4;
    local_2a0 = (long)(iVar22 * 0x10) * 4;
    local_470 = 0;
    auVar41._8_4_ = 0xc0a00000;
    auVar41._0_8_ = 0xc0a00000c0a00000;
    auVar41._12_4_ = 0xc0a00000;
    do {
      if (5 < local_3c8.h) {
        lVar24 = (long)local_3c8.w *
                 CONCAT44(local_3c8.elemsize._4_4_,(undefined4)local_3c8.elemsize);
        local_3d8 = lVar24 * 4;
        lVar32 = CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize) * local_368.cstep
                 * local_470;
        local_468._0_8_ =
             (long)local_3c8.data +
             CONCAT44(local_3c8.elemsize._4_4_,(undefined4)local_3c8.elemsize) * local_3c8.cstep *
             local_470 + 0x50;
        local_478 = 0;
        uVar23 = 0;
        do {
          if (5 < local_3c8.w) {
            uVar25 = 0;
            uVar29 = local_478;
            pfVar26 = (float *)local_468._0_8_;
            do {
              lVar33 = -0x60;
              pfVar27 = pfVar26;
              do {
                auVar37 = *(undefined1 (*) [16])(pfVar27 + -0x10);
                auVar36 = *(undefined1 (*) [16])(pfVar27 + -0xc);
                auVar40 = *(undefined1 (*) [16])(pfVar27 + -8);
                auVar38 = *(undefined1 (*) [16])(pfVar27 + -4);
                fVar42 = pfVar27[-0x13];
                fVar43 = pfVar27[-0x12];
                fVar44 = pfVar27[-0x11];
                auVar47 = vsubps_avx(auVar37,auVar36);
                auVar53 = vsubps_avx(auVar38,auVar40);
                auVar60 = vsubps_avx(auVar37,auVar40);
                auVar64 = vsubps_avx(auVar38,auVar36);
                auVar59._0_4_ = auVar60._0_4_ + auVar60._0_4_;
                auVar59._4_4_ = auVar60._4_4_ + auVar60._4_4_;
                auVar59._8_4_ = auVar60._8_4_ + auVar60._8_4_;
                auVar59._12_4_ = auVar60._12_4_ + auVar60._12_4_;
                auVar60 = vsubps_avx(auVar64,auVar59);
                fVar45 = *pfVar27;
                fVar7 = pfVar27[1];
                fVar8 = pfVar27[2];
                fVar9 = pfVar27[3];
                *(float *)((long)afStack_278 + lVar33 + 0x60) =
                     auVar36._0_4_ * -5.0 + pfVar27[-0x14] * 4.0 + auVar38._0_4_;
                *(float *)((long)afStack_278 + lVar33 + 100) =
                     auVar36._4_4_ * -5.0 + fVar42 * 4.0 + auVar38._4_4_;
                *(float *)((long)afStack_278 + lVar33 + 0x68) =
                     auVar36._8_4_ * -5.0 + fVar43 * 4.0 + auVar38._8_4_;
                *(float *)((long)afStack_278 + lVar33 + 0x6c) =
                     auVar36._12_4_ * -5.0 + fVar44 * 4.0 + auVar38._12_4_;
                *(float *)((long)afStack_278 + lVar33 + 0xc0) =
                     auVar38._0_4_ + auVar40._0_4_ + (auVar36._0_4_ + auVar37._0_4_) * -4.0;
                *(float *)((long)afStack_278 + lVar33 + 0xc4) =
                     auVar38._4_4_ + auVar40._4_4_ + (auVar36._4_4_ + auVar37._4_4_) * -4.0;
                *(float *)((long)afStack_278 + lVar33 + 200) =
                     auVar38._8_4_ + auVar40._8_4_ + (auVar36._8_4_ + auVar37._8_4_) * -4.0;
                *(float *)((long)afStack_278 + lVar33 + 0xcc) =
                     auVar38._12_4_ + auVar40._12_4_ + (auVar36._12_4_ + auVar37._12_4_) * -4.0;
                *(float *)((long)afStack_278 + lVar33 + 0x120) = auVar53._0_4_ + auVar47._0_4_ * 4.0
                ;
                *(float *)((long)afStack_278 + lVar33 + 0x124) = auVar53._4_4_ + auVar47._4_4_ * 4.0
                ;
                *(float *)((long)afStack_278 + lVar33 + 0x128) = auVar53._8_4_ + auVar47._8_4_ * 4.0
                ;
                *(float *)((long)afStack_278 + lVar33 + 300) = auVar53._12_4_ + auVar47._12_4_ * 4.0
                ;
                *(undefined1 (*) [16])((long)afStack_f8 + lVar33) = auVar60;
                *(float *)((long)afStack_f8 + lVar33 + 0x60) = auVar59._0_4_ + auVar64._0_4_;
                *(float *)((long)afStack_f8 + lVar33 + 100) = auVar59._4_4_ + auVar64._4_4_;
                *(float *)((long)afStack_f8 + lVar33 + 0x68) = auVar59._8_4_ + auVar64._8_4_;
                *(float *)((long)afStack_f8 + lVar33 + 0x6c) = auVar59._12_4_ + auVar64._12_4_;
                *(float *)((long)afStack_f8 + lVar33 + 0xc0) =
                     auVar40._0_4_ * -5.0 + auVar37._0_4_ * 4.0 + fVar45;
                *(float *)((long)afStack_f8 + lVar33 + 0xc4) =
                     auVar40._4_4_ * -5.0 + auVar37._4_4_ * 4.0 + fVar7;
                *(float *)(&stack0xffffffffffffffd0 + lVar33) =
                     auVar40._8_4_ * -5.0 + auVar37._8_4_ * 4.0 + fVar8;
                *(float *)(&stack0xffffffffffffffd4 + lVar33) =
                     auVar40._12_4_ * -5.0 + auVar37._12_4_ * 4.0 + fVar9;
                pfVar27 = pfVar27 + local_3c8.w * 4;
                lVar33 = lVar33 + 0x10;
              } while (lVar33 != 0);
              lVar34 = 0x50;
              lVar33 = uVar29;
              do {
                auVar37 = *(undefined1 (*) [16])((long)&local_2b8 + lVar34);
                auVar36 = *(undefined1 (*) [16])((long)&local_2a8 + lVar34);
                auVar40 = *(undefined1 (*) [16])((long)&local_298 + lVar34);
                auVar38 = *(undefined1 (*) [16])(local_288 + lVar34);
                auVar64._0_4_ =
                     auVar36._0_4_ * -5.0 + *(float *)((long)&local_2c8 + lVar34) * 4.0 +
                     auVar38._0_4_;
                auVar64._4_4_ =
                     auVar36._4_4_ * -5.0 + *(float *)((long)&local_2c8 + lVar34 + 4) * 4.0 +
                     auVar38._4_4_;
                auVar64._8_4_ =
                     auVar36._8_4_ * -5.0 + *(float *)((long)&local_2c0 + lVar34) * 4.0 +
                     auVar38._8_4_;
                auVar64._12_4_ =
                     auVar36._12_4_ * -5.0 + *(float *)((long)&local_2c0 + lVar34 + 4) * 4.0 +
                     auVar38._12_4_;
                auVar70._0_4_ =
                     auVar38._0_4_ + auVar40._0_4_ + (auVar36._0_4_ + auVar37._0_4_) * -4.0;
                auVar70._4_4_ =
                     auVar38._4_4_ + auVar40._4_4_ + (auVar36._4_4_ + auVar37._4_4_) * -4.0;
                auVar70._8_4_ =
                     auVar38._8_4_ + auVar40._8_4_ + (auVar36._8_4_ + auVar37._8_4_) * -4.0;
                auVar70._12_4_ =
                     auVar38._12_4_ + auVar40._12_4_ + (auVar36._12_4_ + auVar37._12_4_) * -4.0;
                auVar47 = vsubps_avx(auVar37,auVar36);
                auVar53 = vsubps_avx(auVar38,auVar40);
                auVar71._0_4_ = auVar53._0_4_ + auVar47._0_4_ * 4.0;
                auVar71._4_4_ = auVar53._4_4_ + auVar47._4_4_ * 4.0;
                auVar71._8_4_ = auVar53._8_4_ + auVar47._8_4_ * 4.0;
                auVar71._12_4_ = auVar53._12_4_ + auVar47._12_4_ * 4.0;
                auVar47 = vsubps_avx(auVar37,auVar40);
                auVar36 = vsubps_avx(auVar38,auVar36);
                auVar60._0_4_ = auVar47._0_4_ + auVar47._0_4_;
                auVar60._4_4_ = auVar47._4_4_ + auVar47._4_4_;
                auVar60._8_4_ = auVar47._8_4_ + auVar47._8_4_;
                auVar60._12_4_ = auVar47._12_4_ + auVar47._12_4_;
                auVar38 = vsubps_avx(auVar36,auVar60);
                auVar53._0_4_ = auVar60._0_4_ + auVar36._0_4_;
                auVar53._4_4_ = auVar60._4_4_ + auVar36._4_4_;
                auVar53._8_4_ = auVar60._8_4_ + auVar36._8_4_;
                auVar53._12_4_ = auVar60._12_4_ + auVar36._12_4_;
                auVar47._0_4_ =
                     auVar40._0_4_ * -5.0 + auVar37._0_4_ * 4.0 +
                     *(float *)((long)afStack_278 + lVar34);
                auVar47._4_4_ =
                     auVar40._4_4_ * -5.0 + auVar37._4_4_ * 4.0 +
                     *(float *)((long)afStack_278 + lVar34 + 4);
                auVar47._8_4_ =
                     auVar40._8_4_ * -5.0 + auVar37._8_4_ * 4.0 +
                     *(float *)((long)afStack_278 + lVar34 + 8);
                auVar47._12_4_ =
                     auVar40._12_4_ * -5.0 + auVar37._12_4_ * 4.0 +
                     *(float *)((long)afStack_278 + lVar34 + 0xc);
                *(undefined1 (*) [16])((long)local_368.data + lVar33 + lVar32) = auVar64;
                *(undefined1 (*) [16])((long)local_368.data + (long)local_408 + lVar33 + lVar32) =
                     auVar70;
                *(undefined1 (*) [16])((long)local_368.data + lVar33 + local_290 + lVar32) = auVar71
                ;
                *(undefined1 (*) [16])((long)local_368.data + lVar33 + local_298 + lVar32) = auVar38
                ;
                *(undefined1 (*) [16])((long)local_368.data + lVar33 + local_2a0 + lVar32) = auVar53
                ;
                *(undefined1 (*) [16])((long)local_368.data + lVar33 + local_2a8 + lVar32) = auVar47
                ;
                lVar34 = lVar34 + 0x60;
                lVar33 = lVar33 + (long)(iVar22 * 0x18) * 4;
              } while (lVar34 != 0x290);
              uVar25 = uVar25 + 1;
              pfVar26 = pfVar26 + 0x10;
              uVar29 = uVar29 + 0x10;
            } while (uVar25 != uVar35);
          }
          uVar23 = uVar23 + 1;
          local_468._0_8_ = (float *)(local_468._0_8_ + lVar24 * 4);
          local_478 = local_478 + local_3f0;
        } while (uVar23 != local_3e8);
      }
      local_470 = local_470 + 1;
    } while (local_470 != local_3f8);
  }
  piVar6 = (int *)CONCAT44(local_3c8.refcount._4_4_,local_3c8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_3c8.allocator == (Allocator *)0x0) {
        if (local_3c8.data != (void *)0x0) {
          free(local_3c8.data);
        }
      }
      else {
        (*(local_3c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_3c8.cstep = 0;
  local_3c8.data = (void *)0x0;
  local_3c8.refcount._0_4_ = 0;
  local_3c8.refcount._4_4_ = 0;
  local_3c8.elemsize._0_4_ = 0;
  local_3c8.elemsize._4_4_ = 0;
  local_3c8.elempack = 0;
  local_3c8.h = 0;
  local_3c8.d = 0;
  local_3c8.c = 0;
  local_3c8.allocator = (Allocator *)0x0;
  local_3c8.dims = 0;
  local_3c8.w = 0;
  local_318.cstep = 0;
  local_318.data = (void *)0x0;
  local_318.refcount._0_4_ = 0;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize = 0;
  local_318.elempack = 0;
  local_318.allocator = (Allocator *)0x0;
  local_318.dims = 0;
  local_318.w = 0;
  local_318.h = 0;
  local_318.d = 0;
  local_318.c = 0;
  convolution_winograd_dot_pack4_sse(&local_368,iVar21,local_2b0,&local_318,opt_00);
  local_458.cstep = 0;
  local_458.data = (void *)0x0;
  local_458.refcount._0_4_ = 0;
  local_458.refcount._4_4_ = 0;
  local_458.elemsize._0_4_ = 0;
  local_458.elemsize._4_4_ = 0;
  local_458.elempack = 0;
  local_458.allocator = (Allocator *)0x0;
  local_458.dims = 0;
  local_458.w = 0;
  local_458.h = 0;
  local_458.d = 0;
  local_458.c = 0;
  uVar2 = pMVar19->w;
  uVar4 = pMVar19->h;
  auVar38._4_4_ = uVar4;
  auVar38._0_4_ = uVar2;
  auVar38._8_8_ = 0;
  auVar37 = vpcmpeqd_avx(auVar38,local_288);
  auVar36 = vpmovsxdq_avx(auVar37);
  auVar37 = vpcmpeqd_avx(auVar41,auVar41);
  if (((auVar37 & ~auVar36) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar37 & ~auVar36,0xf)) {
    if (&local_458 != pMVar19) {
      piVar6 = pMVar19->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      local_458.data = pMVar19->data;
      local_458.refcount._0_4_ = SUB84(pMVar19->refcount,0);
      local_458.refcount._4_4_ = (undefined4)((ulong)pMVar19->refcount >> 0x20);
      local_458.elemsize._0_4_ = (undefined4)pMVar19->elemsize;
      local_458.elemsize._4_4_ = (undefined4)(pMVar19->elemsize >> 0x20);
      local_458.elempack = pMVar19->elempack;
      local_458.allocator = pMVar19->allocator;
      uVar15 = pMVar19->dims;
      uVar16 = pMVar19->w;
      uVar17 = pMVar19->h;
      uVar18 = pMVar19->d;
      local_458.c = pMVar19->c;
      local_458.cstep = pMVar19->cstep;
      local_458.dims = uVar15;
      local_458.w = uVar16;
      local_458.h = uVar17;
      local_458.d = uVar18;
    }
  }
  else {
    Mat::create(&local_458,(int)local_2d0,(int)local_2c8,iVar21,local_2b8,local_3d0,
                opt_00->workspace_allocator);
  }
  local_3f8 = (long)local_458.c;
  if (0 < local_3f8) {
    local_3e0 = (ulong)(uint)local_458.w;
    local_400 = (ulong)(uint)local_458.h;
    uVar28 = local_458.h + 3;
    if (-1 < local_458.h) {
      uVar28 = local_458.h;
    }
    local_3e8 = (ulong)(uint)((int)uVar28 >> 2);
    uVar20 = local_458.w + 3;
    if (-1 < local_458.w) {
      uVar20 = local_458.w;
    }
    local_408 = local_2c0->data;
    uVar20 = (int)uVar20 >> 2;
    iVar21 = uVar20 * ((int)uVar28 >> 2);
    local_3f0 = (ulong)uVar20 * 4;
    lVar24 = 0;
    do {
      if (local_408 == (void *)0x0) {
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
      }
      else {
        pfVar26 = (float *)((long)local_408 + lVar24 * 0x10);
        fVar42 = *pfVar26;
        fVar43 = pfVar26[1];
        fVar44 = pfVar26[2];
        fVar45 = pfVar26[3];
      }
      if (3 < local_458.h) {
        local_3d8 = (long)local_458.w *
                    CONCAT44(local_458.elemsize._4_4_,(undefined4)local_458.elemsize) * 4;
        local_468._0_8_ =
             (long)local_458.data +
             CONCAT44(local_458.elemsize._4_4_,(undefined4)local_458.elemsize) * local_458.cstep *
             lVar24 + 0x30;
        local_478 = 0;
        uVar35 = 0;
        do {
          if (3 < local_458.w) {
            uVar29 = 0;
            pauVar30 = (undefined1 (*) [16])local_468._0_8_;
            uVar23 = local_478;
            do {
              pfVar26 = (float *)((long)local_318.data +
                                 (uVar23 >> 2 & 0x3fffffff) * 0x10 +
                                 local_318.elemsize * local_318.cstep * lVar24);
              lVar32 = -0x60;
              do {
                auVar37 = *(undefined1 (*) [16])(pfVar26 + iVar21 * 4);
                auVar41 = *(undefined1 (*) [16])(pfVar26 + iVar21 * 8);
                auVar36 = *(undefined1 (*) [16])(pfVar26 + iVar21 * 0xc);
                auVar40 = *(undefined1 (*) [16])(pfVar26 + iVar21 * 0x10);
                fVar62 = auVar41._0_4_ + auVar37._0_4_;
                fVar65 = auVar41._4_4_ + auVar37._4_4_;
                fVar67 = auVar41._8_4_ + auVar37._8_4_;
                fVar69 = auVar41._12_4_ + auVar37._12_4_;
                auVar37 = vsubps_avx(auVar37,auVar41);
                fVar52 = auVar40._0_4_ + auVar36._0_4_;
                fVar55 = auVar40._4_4_ + auVar36._4_4_;
                fVar56 = auVar40._8_4_ + auVar36._8_4_;
                fVar57 = auVar40._12_4_ + auVar36._12_4_;
                fVar46 = pfVar26[1];
                fVar49 = pfVar26[2];
                fVar50 = pfVar26[3];
                auVar41 = vsubps_avx(auVar36,auVar40);
                fVar7 = auVar41._0_4_;
                fVar8 = auVar41._4_4_;
                fVar9 = auVar41._8_4_;
                fVar10 = auVar41._12_4_;
                pfVar27 = pfVar26 + iVar21 * 0x14;
                fVar51 = *pfVar27;
                fVar63 = pfVar27[1];
                fVar66 = pfVar27[2];
                fVar68 = pfVar27[3];
                *(float *)((long)afStack_278 + lVar32 + 0x60) = fVar62 + *pfVar26 + fVar52;
                *(float *)((long)afStack_278 + lVar32 + 100) = fVar65 + fVar46 + fVar55;
                *(float *)((long)afStack_278 + lVar32 + 0x68) = fVar67 + fVar49 + fVar56;
                *(float *)((long)afStack_278 + lVar32 + 0x6c) = fVar69 + fVar50 + fVar57;
                *(float *)((long)afStack_278 + lVar32 + 0xc0) = fVar7 + fVar7 + auVar37._0_4_;
                *(float *)((long)afStack_278 + lVar32 + 0xc4) = fVar8 + fVar8 + auVar37._4_4_;
                *(float *)((long)afStack_278 + lVar32 + 200) = fVar9 + fVar9 + auVar37._8_4_;
                *(float *)((long)afStack_278 + lVar32 + 0xcc) = fVar10 + fVar10 + auVar37._12_4_;
                *(float *)((long)afStack_278 + lVar32 + 0x120) = fVar52 * 4.0 + fVar62;
                *(float *)((long)afStack_278 + lVar32 + 0x124) = fVar55 * 4.0 + fVar65;
                *(float *)((long)afStack_278 + lVar32 + 0x128) = fVar56 * 4.0 + fVar67;
                *(float *)((long)afStack_278 + lVar32 + 300) = fVar57 * 4.0 + fVar69;
                *(float *)((long)afStack_f8 + lVar32) = auVar37._0_4_ + fVar51 + fVar7 * 8.0;
                *(float *)((long)afStack_f8 + lVar32 + 4) = auVar37._4_4_ + fVar63 + fVar8 * 8.0;
                *(float *)((long)afStack_f8 + lVar32 + 8) = auVar37._8_4_ + fVar66 + fVar9 * 8.0;
                *(float *)((long)afStack_f8 + lVar32 + 0xc) = auVar37._12_4_ + fVar68 + fVar10 * 8.0
                ;
                pfVar26 = pfVar26 + iVar21 * 0x18;
                lVar32 = lVar32 + 0x10;
              } while (lVar32 != 0);
              lVar32 = 0x50;
              pauVar31 = pauVar30;
              do {
                auVar37 = *(undefined1 (*) [16])((long)&local_2b8 + lVar32);
                auVar41 = *(undefined1 (*) [16])((long)&local_2a8 + lVar32);
                auVar36 = *(undefined1 (*) [16])((long)&local_298 + lVar32);
                auVar40 = *(undefined1 (*) [16])(local_288 + lVar32);
                auVar38 = vsubps_avx(auVar37,auVar41);
                fVar55 = auVar40._0_4_ + auVar36._0_4_;
                fVar56 = auVar40._4_4_ + auVar36._4_4_;
                fVar57 = auVar40._8_4_ + auVar36._8_4_;
                fVar62 = auVar40._12_4_ + auVar36._12_4_;
                auVar36 = vsubps_avx(auVar36,auVar40);
                fVar46 = auVar37._0_4_ + fVar42 + auVar41._0_4_;
                fVar49 = auVar37._4_4_ + fVar43 + auVar41._4_4_;
                fVar50 = auVar37._8_4_ + fVar44 + auVar41._8_4_;
                fVar51 = auVar37._12_4_ + fVar45 + auVar41._12_4_;
                auVar54._0_4_ = fVar55 + fVar46 + *(float *)((long)&local_2c8 + lVar32);
                auVar54._4_4_ = fVar56 + fVar49 + *(float *)((long)&local_2c8 + lVar32 + 4);
                auVar54._8_4_ = fVar57 + fVar50 + *(float *)((long)&local_2c0 + lVar32);
                auVar54._12_4_ = fVar62 + fVar51 + *(float *)((long)&local_2c0 + lVar32 + 4);
                fVar7 = auVar36._0_4_;
                fVar8 = auVar36._4_4_;
                fVar9 = auVar36._8_4_;
                fVar10 = auVar36._12_4_;
                fVar63 = auVar38._0_4_ + fVar42;
                fVar66 = auVar38._4_4_ + fVar43;
                fVar68 = auVar38._8_4_ + fVar44;
                fVar52 = auVar38._12_4_ + fVar45;
                auVar61._0_4_ = fVar7 + fVar7 + fVar63;
                auVar61._4_4_ = fVar8 + fVar8 + fVar66;
                auVar61._8_4_ = fVar9 + fVar9 + fVar68;
                auVar61._12_4_ = fVar10 + fVar10 + fVar52;
                auVar48._0_4_ = fVar55 * 4.0 + fVar46;
                auVar48._4_4_ = fVar56 * 4.0 + fVar49;
                auVar48._8_4_ = fVar57 * 4.0 + fVar50;
                auVar48._12_4_ = fVar62 * 4.0 + fVar51;
                auVar58._0_4_ = fVar63 + *(float *)((long)afStack_278 + lVar32) + fVar7 * 8.0;
                auVar58._4_4_ = fVar66 + *(float *)((long)afStack_278 + lVar32 + 4) + fVar8 * 8.0;
                auVar58._8_4_ = fVar68 + *(float *)((long)afStack_278 + lVar32 + 8) + fVar9 * 8.0;
                auVar58._12_4_ =
                     fVar52 + *(float *)((long)afStack_278 + lVar32 + 0xc) + fVar10 * 8.0;
                pauVar31[-3] = auVar54;
                pauVar31[-2] = auVar61;
                pauVar31[-1] = auVar48;
                *pauVar31 = auVar58;
                lVar32 = lVar32 + 0x60;
                pauVar31 = (undefined1 (*) [16])(*pauVar31 + (long)(local_458.w * 4) * 4);
              } while (lVar32 != 0x1d0);
              uVar29 = uVar29 + 1;
              uVar23 = uVar23 + 4;
              pauVar30 = pauVar30 + 4;
            } while (uVar29 != uVar20);
          }
          uVar35 = uVar35 + 1;
          local_478 = local_478 + local_3f0;
          local_468._0_8_ = (undefined1 *)local_468._0_8_ + local_3d8;
        } while (uVar35 != local_3e8);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != local_3f8);
  }
  copy_cut_border(&local_458,local_370,0,local_458.h - local_370->h,0,local_458.w - local_370->w,
                  local_378);
  piVar6 = (int *)CONCAT44(local_458.refcount._4_4_,local_458.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_458.allocator == (Allocator *)0x0) {
        if (local_458.data != (void *)0x0) {
          free(local_458.data);
        }
      }
      else {
        (*(local_458.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_458.cstep = 0;
  auVar39 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
  local_458.data = (void *)0x0;
  local_458.refcount._0_4_ = 0;
  local_458.refcount._4_4_ = 0;
  local_458.elemsize._0_4_ = 0;
  local_458.elemsize._4_4_ = 0;
  local_458.elempack = 0;
  local_458.dims = 0;
  local_458.w = 0;
  local_458.h = 0;
  local_458.d = 0;
  local_458.c = 0;
  piVar6 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_318.allocator == (Allocator *)0x0) {
        if (local_318.data != (void *)0x0) {
          free(local_318.data);
          auVar39 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
        }
      }
      else {
        (*(local_318.allocator)->_vptr_Allocator[3])();
        auVar39 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
      }
    }
  }
  local_318.cstep = 0;
  local_318.data = (void *)0x0;
  local_318.refcount._0_4_ = auVar39._4_4_;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize = auVar39._0_8_;
  local_318.elempack = auVar39._8_4_;
  local_318.w = 0;
  local_318._48_8_ = auVar39._4_8_;
  local_318.c = 0;
  piVar6 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
  local_318.dims = local_318.refcount._4_4_;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_368.allocator == (Allocator *)0x0) {
        if (local_368.data != (void *)0x0) {
          free(local_368.data);
        }
      }
      else {
        (*(local_368.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_368.cstep = 0;
  local_368.data = (void *)0x0;
  local_368.refcount._0_4_ = 0;
  local_368.refcount._4_4_ = 0;
  local_368.elemsize._0_4_ = 0;
  local_368.elemsize._4_4_ = 0;
  local_368.elempack = 0;
  local_368.dims = 0;
  local_368.w = 0;
  local_368.h = 0;
  local_368.d = 0;
  local_368.c = 0;
  piVar6 = (int *)CONCAT44(local_3c8.refcount._4_4_,local_3c8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_3c8.allocator == (Allocator *)0x0) {
        if (local_3c8.data != (void *)0x0) {
          free(local_3c8.data);
        }
      }
      else {
        (*(local_3c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 4;
        int h_tiles = outh / 4;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 36, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd43_transform_input_pack4_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack4_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd43_transform_output_pack4_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}